

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::LimitingInputStream::BackUp(LimitingInputStream *this,int count)

{
  int in_ESI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x10) < 0) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x18))
              (*(long **)(in_RDI + 8),in_ESI - (int)*(undefined8 *)(in_RDI + 0x10));
    *(long *)(in_RDI + 0x10) = (long)in_ESI;
  }
  else {
    (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),in_ESI);
    *(long *)(in_RDI + 0x10) = (long)in_ESI + *(long *)(in_RDI + 0x10);
  }
  return;
}

Assistant:

void LimitingInputStream::BackUp(int count) {
  if (limit_ < 0) {
    input_->BackUp(count - limit_);
    limit_ = count;
  } else {
    input_->BackUp(count);
    limit_ += count;
  }
}